

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O1

int zlib_check(file *file,png_uint_32 offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  zlib zlib;
  fpos_t start_pos;
  zlib local_118;
  fpos_t local_40;
  
  file_getpos(file,&local_40);
  local_118.chunk = file->chunk;
  local_118.idat = file->idat;
  lVar6 = 0;
  do {
    uVar7 = (clear_clear_seed_1 << 7 | clear_clear_seed_0 >> 0x19) ^ clear_clear_seed_0 >> 0xc;
    clear_clear_seed_1 = clear_clear_seed_1 << 8 | clear_clear_seed_0 >> 0x18;
    clear_clear_seed_0 = clear_clear_seed_0 << 8 | uVar7 & 0xff;
    *(char *)((long)local_118.compressed_bytes + lVar6 + -0x24) = (char)uVar7;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd8);
  local_118.file = (local_118.chunk)->file;
  local_118.global = (local_118.chunk)->global;
  local_118.z.next_in = (Bytef *)0x0;
  local_118.z.avail_in = 0;
  local_118.z.zalloc = (alloc_func)0x0;
  local_118.z.zfree = (free_func)0x0;
  local_118.z.opaque = (voidpf)0x0;
  local_118.state = -1;
  local_118.window_bits = 0;
  local_118.compressed_digits = 0;
  local_118.uncompressed_digits = 0;
  local_118.file_bits = 0x18;
  local_118.ok_bits = 0x10;
  local_118.cksum = 0;
  local_118.rewrite_offset = offset;
  iVar2 = inflateInit2_(&local_118.z,0,"1.2.11");
  local_118.rc = iVar2;
  if (iVar2 == 0) {
    local_118.state = 0;
  }
  else {
    zlib_message(&local_118,1);
  }
  iVar4 = 0;
  if (iVar2 != 0) goto LAB_00106825;
  iVar2 = zlib_run(&local_118);
  if (iVar2 == 1) {
    if ((((undefined1  [96])((undefined1  [96])*local_118.global & (undefined1  [96])0x4) ==
          (undefined1  [96])0x0) && (local_118.window_bits == local_118.file_bits)) &&
       (iVar4 = 1, local_118.cksum == 0)) goto LAB_00106825;
    iVar2 = 0xf;
    if (((((local_118.uncompressed_digits < 2) && (local_118.uncompressed_bytes[0] < 0x4001)) &&
         ((iVar2 = 0xe, local_118.uncompressed_bytes[0] < 0x2001 &&
          ((iVar2 = 0xd, local_118.uncompressed_bytes[0] < 0x1001 &&
           (iVar2 = 0xc, local_118.uncompressed_bytes[0] < 0x801)))))) &&
        (iVar2 = 0xb, local_118.uncompressed_bytes[0] < 0x401)) &&
       (iVar2 = 10, local_118.uncompressed_bytes[0] < 0x201)) {
      iVar2 = 9 - (uint)(local_118.uncompressed_bytes[0] < 0x101);
    }
    if (local_118.ok_bits < iVar2) {
      iVar2 = local_118.ok_bits;
    }
    iVar4 = 8;
    if (local_118.cksum != 0) {
      type_message((local_118.chunk)->file,(local_118.chunk)->chunk_type,"zlib checksum");
    }
  }
  else {
    if (iVar2 == 0) {
      local_118.z.msg = "[truncated]";
      iVar4 = 0;
      zlib_message(&local_118,0);
      goto LAB_00106825;
    }
    iVar4 = 0;
    if (iVar2 != -1) goto LAB_00106825;
    *(byte *)&file->status_code = (byte)file->status_code | 1;
    iVar4 = local_118.window_bits + 1;
    iVar2 = 0xf;
  }
  while ((iVar4 < iVar2 || (iVar2 < local_118.ok_bits))) {
    if (local_118.state < 0) {
      __assert_fail("zlib->state >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0x872,"int zlib_reset(struct zlib *, int)");
    }
    iVar8 = iVar2 + iVar4 >> 1;
    local_118.z.next_in = (Bytef *)0x0;
    local_118.z.avail_in = 0;
    local_118.z.next_out = (Bytef *)0x0;
    local_118.z.avail_out = 0;
    local_118.compressed_digits = 0;
    local_118.uncompressed_digits = 0;
    local_118.state = 0;
    local_118.window_bits = iVar8;
    local_118.rc = inflateReset2(&local_118.z,0);
    iVar5 = 1;
    if (local_118.rc == 0) {
      file_setpos(file,&local_40);
      iVar3 = zlib_run(&local_118);
      bVar1 = true;
      iVar5 = iVar8;
      if (iVar3 != 1) {
        if (iVar3 != -1) goto LAB_001069cc;
        iVar4 = iVar8 + 1;
        iVar5 = iVar2;
        if (iVar2 <= iVar8) {
          if (iVar8 != 0xf) {
            __assert_fail("test_bits == 15",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0xa8a,"int zlib_check(struct file *, png_uint_32)");
          }
          iVar5 = 0;
          if (local_118.z.msg == (char *)0x0) {
            local_118.z.msg = "invalid distance too far back";
          }
          goto LAB_001069c4;
        }
      }
    }
    else {
LAB_001069c4:
      zlib_message(&local_118,iVar5);
LAB_001069cc:
      zlib_end(&local_118);
      bVar1 = false;
      iVar5 = iVar2;
    }
    iVar2 = iVar5;
    if (!bVar1) {
      return 0;
    }
  }
  iVar4 = 1;
  if (iVar2 != local_118.ok_bits) {
    __assert_fail("zlib.ok_bits == max_bits",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                  ,0xaac,"int zlib_check(struct file *, png_uint_32)");
  }
LAB_00106825:
  zlib_end(&local_118);
  return iVar4;
}

Assistant:

static int /* global function; not a member function */
zlib_check(struct file *file, png_uint_32 offset)
   /* Check the stream of zlib compressed data in either idat (if given) or (if
    * not) chunk.  In fact it is zlib_run that handles the difference in reading
    * a single chunk and a list of IDAT chunks.
    *
    * In either case the input file must be positioned at the first byte of zlib
    * compressed data (the first header byte).
    *
    * The return value is true on success, including the case where the zlib
    * header may need to be rewritten, and false on an unrecoverable error.
    *
    * In the case of IDAT chunks 'offset' should be 0.
    */
{
   fpos_t start_pos;
   struct zlib zlib;

   /* Record the start of the LZ data to allow a re-read. */
   file_getpos(file, &start_pos);

   /* First test the existing (file) window bits: */
   if (zlib_init(&zlib, file->idat, file->chunk, 0/*window bits*/, offset))
   {
      int min_bits, max_bits, rc;

      /* The first run using the existing window bits. */
      rc = zlib_run(&zlib);

      switch (rc)
      {
         case ZLIB_TOO_FAR_BACK:
            /* too far back error */
            file->status_code |= TOO_FAR_BACK;
            min_bits = zlib.window_bits + 1;
            max_bits = 15;
            break;

         case ZLIB_STREAM_END:
            if (!zlib.global->optimize_zlib &&
               zlib.window_bits == zlib.file_bits && !zlib.cksum)
            {
               /* The trivial case where the stream is ok and optimization was
                * not requested.
                */
               zlib_end(&zlib);
               return 1;
            }

            max_bits = max_window_bits(zlib.uncompressed_bytes,
               zlib.uncompressed_digits);
            if (zlib.ok_bits < max_bits)
               max_bits = zlib.ok_bits;
            min_bits = 8;

            /* cksum is set if there is an error in the zlib header checksum
             * calculation in the original file (and this may be the only reason
             * a rewrite is required).  We can't rely on the file window bits in
             * this case, so do the optimization anyway.
             */
            if (zlib.cksum)
               chunk_message(zlib.chunk, "zlib checksum");
            break;


         case ZLIB_OK:
            /* Truncated stream; unrecoverable, gets converted to ZLIB_FATAL */
            zlib.z.msg = PNGZ_MSG_CAST("[truncated]");
            zlib_message(&zlib, 0/*expected*/);
            /* FALLTHROUGH */

         default:
            /* Unrecoverable error; skip the chunk; a zlib_message has already
             * been output.
             */
            zlib_end(&zlib);
            return 0;
      }

      /* Optimize window bits or fix a too-far-back error.  min_bits and
       * max_bits have been set appropriately, ok_bits records the bit value
       * known to work.
       */
      while (min_bits < max_bits || max_bits < zlib.ok_bits/*if 16*/)
      {
         int test_bits = (min_bits + max_bits) >> 1;

         if (zlib_reset(&zlib, test_bits))
         {
            file_setpos(file, &start_pos);
            rc = zlib_run(&zlib);

            switch (rc)
            {
               case ZLIB_TOO_FAR_BACK:
                  min_bits = test_bits+1;
                  if (min_bits > max_bits)
                  {
                     /* This happens when the stream really is damaged and it
                      * contains a distance code that addresses bytes before
                      * the start of the uncompressed data.
                      */
                     assert(test_bits == 15);

                     /* Output the error that wasn't output before: */
                     if (zlib.z.msg == NULL)
                        zlib.z.msg = PNGZ_MSG_CAST(
                           "invalid distance too far back");
                     zlib_message(&zlib, 0/*stream error*/);
                     zlib_end(&zlib);
                     return 0;
                  }
                  break;

               case ZLIB_STREAM_END: /* success */
                  max_bits = test_bits;
                  break;

               default:
                  /* A fatal error; this happens if a too-far-back error was
                   * hiding a more serious error, zlib_advance has already
                   * output a zlib_message.
                   */
                  zlib_end(&zlib);
                  return 0;
            }
         }

         else /* inflateReset2 failed */
         {
            zlib_end(&zlib);
            return 0;
         }
      }

      /* The loop guarantees this */
      assert(zlib.ok_bits == max_bits);
      zlib_end(&zlib);
      return 1;
   }

   else /* zlib initialization failed - skip the chunk */
   {
      zlib_end(&zlib);
      return 0;
   }
}